

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O0

int readint(uchar *infile)

{
  uint uVar1;
  uchar b [4];
  int i;
  int a;
  undefined4 in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  int iVar2;
  undefined4 in_stack_fffffffffffffff4;
  
  for (iVar2 = 0; iVar2 < 4; iVar2 = iVar2 + 1) {
    qread((uchar *)CONCAT44(in_stack_fffffffffffffff4,iVar2),
          (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),0);
  }
  uVar1 = in_stack_ffffffffffffffec & 0xff;
  for (iVar2 = 1; iVar2 < 4; iVar2 = iVar2 + 1) {
    uVar1 = uVar1 * 0x100 + (uint)(byte)(&stack0xffffffffffffffec)[iVar2];
  }
  return uVar1;
}

Assistant:

static int readint(unsigned char *infile)
{
int a,i;
unsigned char b[4];

	/* Read integer A one byte at a time from infile.
	 *
	 * This is portable from Vax to Sun since it eliminates the
	 * need for byte-swapping.
	 *
         *  This routine is only called to read the first 3 values
	 *  in the compressed file, so it doesn't have to be 
	 *  super-efficient
	 */
	for (i=0; i<4; i++) qread(infile,(char *) &b[i],1);
	a = b[0];
	for (i=1; i<4; i++) a = (a<<8) + b[i];
	return(a);
}